

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_char16_t> *b)

{
  ArrayOptions *pAVar1;
  __atomic_base<int> _Var2;
  QAbstractConcatenable *this;
  QString *pQVar3;
  QChar *pQVar4;
  Data *pDVar5;
  QChar *out;
  long lVar6;
  QChar *alloc;
  char16_t *pcVar7;
  long lVar8;
  char16_t *pcVar9;
  QLatin1StringView in;
  
  pDVar5 = (a->d).d;
  lVar6 = (a->d).size;
  out = (QChar *)(((b->a).b)->d).size;
  alloc = (QChar *)((long)&out->ucs + (b->a).a.m_size + lVar6 + 1);
  if ((pDVar5 == (Data *)0x0) ||
     (_Var2._M_i = (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i,
     out = (QChar *)(ulong)(uint)_Var2._M_i, 1 < _Var2._M_i)) {
    QString::reallocData(a,lVar6,KeepSize);
    pDVar5 = (a->d).d;
    if (pDVar5 != (Data *)0x0) goto LAB_003d7981;
    if (0 < (long)alloc) {
      out = (QChar *)(a->d).size;
      goto LAB_003d79d6;
    }
  }
  else {
LAB_003d7981:
    lVar6 = (pDVar5->super_QArrayData).alloc;
    out = (QChar *)(a->d).size;
    lVar8 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar6 - (long)out) - lVar8 < (long)alloc) {
      pQVar4 = (QChar *)(lVar6 * 2);
      if (lVar6 * 2 < (long)alloc) {
        pQVar4 = alloc;
      }
      alloc = pQVar4;
      if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar6 - lVar8 <= (long)alloc)) {
LAB_003d79d6:
        if ((long)alloc < (long)out) {
          alloc = out;
        }
        QString::reallocData(a,(qsizetype)alloc,KeepSize);
        pDVar5 = (a->d).d;
        if (pDVar5 == (Data *)0x0) goto LAB_003d7a06;
        lVar6 = (pDVar5->super_QArrayData).alloc;
      }
      if (lVar6 != 0) {
        pAVar1 = &(pDVar5->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_003d7a17;
  }
LAB_003d7a06:
  QString::reallocData(a,(a->d).size,KeepSize);
LAB_003d7a17:
  pcVar9 = (a->d).ptr + (a->d).size;
  this = (QAbstractConcatenable *)(b->a).a.m_size;
  in.m_data = (char *)pcVar9;
  in.m_size = (qsizetype)(b->a).a.m_data;
  QAbstractConcatenable::appendLatin1To(this,in,out);
  pcVar9 = pcVar9 + (long)this;
  pQVar3 = (b->a).b;
  lVar6 = (pQVar3->d).size;
  if (lVar6 != 0) {
    pcVar7 = (pQVar3->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = &QString::_empty;
    }
    memcpy(pcVar9,pcVar7,lVar6 * 2);
  }
  pcVar9[lVar6] = b->b;
  pcVar7 = (a->d).ptr;
  if (pcVar7 == (char16_t *)0x0) {
    pcVar7 = &QString::_empty;
  }
  QString::resize(a,(long)(pcVar9 + lVar6) + (2 - (long)pcVar7) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}